

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlCharInRange(void)

{
  int iVar1;
  uint val_00;
  int iVar2;
  int local_2c;
  int n_rptr;
  xmlChRangeGroup *rptr;
  int n_val;
  uint val;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (rptr._4_4_ = 0; (int)rptr._4_4_ < 3; rptr._4_4_ = rptr._4_4_ + 1) {
    for (local_2c = 0; local_2c < 1; local_2c = local_2c + 1) {
      iVar1 = xmlMemBlocks();
      val_00 = gen_unsigned_int(rptr._4_4_,0);
      iVar2 = xmlCharInRange(val_00,0);
      desret_int(iVar2);
      call_tests = call_tests + 1;
      des_unsigned_int(rptr._4_4_,val_00,0);
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlCharInRange",(ulong)(uint)(iVar2 - iVar1));
        ret_val = ret_val + 1;
        printf(" %d",(ulong)rptr._4_4_);
        printf(" %d");
        printf("\n");
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlCharInRange(void) {
    int test_ret = 0;

    int mem_base;
    int ret_val;
    unsigned int val; /* character to be validated */
    int n_val;
    const xmlChRangeGroup * rptr; /* pointer to range to be used to validate */
    int n_rptr;

    for (n_val = 0;n_val < gen_nb_unsigned_int;n_val++) {
    for (n_rptr = 0;n_rptr < gen_nb_const_xmlChRangeGroup_ptr;n_rptr++) {
        mem_base = xmlMemBlocks();
        val = gen_unsigned_int(n_val, 0);
        rptr = gen_const_xmlChRangeGroup_ptr(n_rptr, 1);

        ret_val = xmlCharInRange(val, rptr);
        desret_int(ret_val);
        call_tests++;
        des_unsigned_int(n_val, val, 0);
        des_const_xmlChRangeGroup_ptr(n_rptr, rptr, 1);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlCharInRange",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_val);
            printf(" %d", n_rptr);
            printf("\n");
        }
    }
    }
    function_tests++;

    return(test_ret);
}